

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int updatewindow(z_streamp strm,uint out)

{
  internal_state *piVar1;
  uint uVar2;
  void *__dest;
  uint uVar3;
  uint uVar4;
  
  piVar1 = strm->state;
  __dest = *(void **)(piVar1 + 0x40);
  if (__dest == (void *)0x0) {
    __dest = (*strm->zalloc)(strm->opaque,1 << ((byte)piVar1[0x30] & 0x1f),1);
    *(void **)(piVar1 + 0x40) = __dest;
    if (__dest == (voidpf)0x0) {
      return 1;
    }
  }
  uVar4 = *(uint *)(piVar1 + 0x34);
  if (uVar4 == 0) {
    uVar4 = 1 << ((byte)piVar1[0x30] & 0x1f);
    *(uint *)(piVar1 + 0x34) = uVar4;
    *(undefined8 *)(piVar1 + 0x38) = 0;
  }
  uVar3 = out - strm->avail_out;
  if (uVar3 < uVar4) {
    uVar4 = uVar4 - *(uint *)(piVar1 + 0x3c);
    uVar2 = uVar3;
    if (uVar4 < uVar3) {
      uVar2 = uVar4;
    }
    memcpy((void *)((long)__dest + (ulong)*(uint *)(piVar1 + 0x3c)),strm->next_out + -(ulong)uVar3,
           (ulong)uVar2);
    if (uVar3 <= uVar4) {
      uVar4 = *(int *)(piVar1 + 0x3c) + uVar2;
      if (*(int *)(piVar1 + 0x3c) + uVar2 == *(uint *)(piVar1 + 0x34)) {
        uVar4 = 0;
      }
      *(uint *)(piVar1 + 0x3c) = uVar4;
      if (*(uint *)(piVar1 + 0x34) <= *(uint *)(piVar1 + 0x38)) {
        return 0;
      }
      *(uint *)(piVar1 + 0x38) = *(uint *)(piVar1 + 0x38) + uVar2;
      return 0;
    }
    uVar3 = uVar3 - uVar2;
    memcpy(*(void **)(piVar1 + 0x40),strm->next_out + -(ulong)uVar3,(ulong)uVar3);
    *(uint *)(piVar1 + 0x3c) = uVar3;
  }
  else {
    memcpy(__dest,strm->next_out + -(ulong)uVar4,(ulong)uVar4);
    *(undefined4 *)(piVar1 + 0x3c) = 0;
  }
  *(undefined4 *)(piVar1 + 0x38) = *(undefined4 *)(piVar1 + 0x34);
  return 0;
}

Assistant:

local int updatewindow(strm, out)
z_streamp strm;
unsigned out;
{
    struct inflate_state FAR *state;
    unsigned copy, dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->wnext = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    copy = out - strm->avail_out;
    if (copy >= state->wsize) {
        zmemcpy(state->window, strm->next_out - state->wsize, state->wsize);
        state->wnext = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->wnext;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->wnext, strm->next_out - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, strm->next_out - copy, copy);
            state->wnext = copy;
            state->whave = state->wsize;
        }
        else {
            state->wnext += dist;
            if (state->wnext == state->wsize) state->wnext = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}